

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL Js::JavascriptArray::TemplatedGetItem<Js::JavascriptNativeFloatArray>
               (JavascriptNativeFloatArray *pArr,uint32 index,Var *element,
               ScriptContext *scriptContext,bool checkHasItem)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  bool checkHasItem_local;
  ScriptContext *scriptContext_local;
  Var *element_local;
  uint32 index_local;
  JavascriptNativeFloatArray *pArr_local;
  
  bVar2 = VirtualTableInfo<Js::JavascriptNativeFloatArray>::HasVirtualTable(pArr);
  if (!bVar2) {
    bVar2 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::HasVirtualTable
                      (pArr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x104d,
                                  "(VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pArr) || VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::HasVirtualTable(pArr))"
                                  ,
                                  "VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pArr) || VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::HasVirtualTable(pArr)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  BVar3 = JavascriptNativeFloatArray::DirectGetItemAtFull(pArr,index,element);
  return BVar3;
}

Assistant:

BOOL JavascriptArray::TemplatedGetItem(JavascriptNativeFloatArray *pArr, uint32 index, Var * element, ScriptContext * scriptContext, bool checkHasItem)
    {
        Assert(VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pArr)
            || VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::HasVirtualTable(pArr));
        return pArr->JavascriptNativeFloatArray::DirectGetItemAtFull(index, element);
    }